

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O0

void __thiscall Hes_Apu::end_frame(Hes_Apu *this,blip_time_t end_time)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  Hes_Osc *osc;
  blip_time_t in_stack_00000034;
  synth_t *in_stack_00000038;
  Hes_Osc *in_stack_00000040;
  undefined8 local_18;
  
  local_18 = in_RDI + 0x2a0;
  do {
    lVar1 = local_18 + -0x70;
    if (*(int *)(local_18 + -0x38) < in_ESI) {
      Hes_Osc::run_until(in_stack_00000040,in_stack_00000038,in_stack_00000034);
    }
    *(int *)(local_18 + -0x38) = *(int *)(local_18 + -0x38) - in_ESI;
    local_18 = lVar1;
  } while (lVar1 != in_RDI);
  return;
}

Assistant:

void Hes_Apu::end_frame( blip_time_t end_time )
{
	Hes_Osc* osc = &oscs [osc_count];
	do
	{
		osc--;
		if ( end_time > osc->last_time )
			osc->run_until( synth, end_time );
		assert( osc->last_time >= end_time );
		osc->last_time -= end_time;
	}
	while ( osc != oscs );
}